

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pager_end_transaction(Pager *pPager,int hasSuper,int bCommit)

{
  byte bVar1;
  u8 uVar2;
  sqlite3_file *psVar3;
  sqlite3_io_methods *psVar4;
  sqlite3_io_methods *psVar5;
  long lVar6;
  _func_int_sqlite3_vfs_ptr_char_ptr_int *p_Var7;
  Wal *pWVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  PgHdr *pPVar12;
  MemJournal *p;
  PCache *pCache;
  long in_FS_OFFSET;
  bool bVar13;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((pPager->eState < 2) && (iVar10 = 0, pPager->eLock < 2)) goto LAB_0013a4b0;
  releaseAllSavepoints(pPager);
  psVar3 = pPager->jfd;
  psVar4 = psVar3->pMethods;
  iVar10 = 0;
  iVar9 = 0;
  if (psVar4 != (sqlite3_io_methods *)0x0) {
    iVar9 = iVar10;
    if (psVar4 == &MemJournalMethods) {
      psVar4 = psVar3[2].pMethods;
      while (psVar4 != (sqlite3_io_methods *)0x0) {
        psVar5 = *(sqlite3_io_methods **)psVar4;
        sqlite3_free(psVar4);
        psVar4 = psVar5;
      }
      psVar3->pMethods = (sqlite3_io_methods *)0x0;
    }
    else {
      bVar1 = pPager->journalMode;
      if (bVar1 == 1) {
LAB_0013a218:
        bVar13 = true;
        if (hasSuper == 0) {
          bVar13 = pPager->tempFile != '\0';
        }
        if (pPager->journalOff == 0) {
LAB_0013a24b:
          iVar9 = 0;
        }
        else {
          lVar6 = pPager->journalSizeLimit;
          if ((bool)(bVar13 | lVar6 == 0)) {
            iVar9 = (*psVar4->xTruncate)(psVar3,0);
          }
          else {
            iVar9 = (*psVar4->xWrite)(psVar3,zeroJournalHdr_zeroHdr,0x1c,0);
          }
          if (iVar9 == 0) {
            iVar9 = 0;
            if (pPager->noSync == '\0') {
              iVar9 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,pPager->syncFlags | 0x10);
            }
            if (0 < lVar6 && iVar9 == 0) {
              local_40 = &DAT_aaaaaaaaaaaaaaaa;
              iVar9 = (*pPager->jfd->pMethods->xFileSize)(pPager->jfd,(sqlite3_int64 *)&local_40);
              if ((iVar9 == 0) && (iVar9 = 0, lVar6 < (long)local_40)) {
                iVar9 = (*pPager->jfd->pMethods->xTruncate)(pPager->jfd,lVar6);
              }
            }
          }
        }
      }
      else {
        if (bVar1 != 3) {
          if ((4 < bVar1) || (pPager->exclusiveMode == '\0')) {
            uVar2 = pPager->tempFile;
            (*psVar4->xClose)(psVar3);
            psVar3->pMethods = (sqlite3_io_methods *)0x0;
            if (uVar2 == '\0') {
              p_Var7 = pPager->pVfs->xDelete;
              if (p_Var7 != (_func_int_sqlite3_vfs_ptr_char_ptr_int *)0x0) {
                iVar9 = (*p_Var7)(pPager->pVfs,pPager->zJournal,(uint)pPager->extraSync);
              }
            }
            goto LAB_0013a323;
          }
          goto LAB_0013a218;
        }
        if (pPager->journalOff == 0) goto LAB_0013a24b;
        iVar9 = (*psVar4->xTruncate)(psVar3,0);
        if (iVar9 == 0) {
          if (pPager->fullSync == '\0') goto LAB_0013a24b;
          iVar9 = 0;
          if (pPager->syncFlags != 0) {
            iVar9 = (*pPager->jfd->pMethods->xSync)(pPager->jfd,(uint)pPager->syncFlags);
          }
        }
      }
      pPager->journalOff = 0;
    }
  }
LAB_0013a323:
  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = (Bitvec *)0x0;
  pPager->nRec = 0;
  if (iVar9 == 0) {
    if ((pPager->memDb == '\0') && (iVar10 = pagerFlushOnCommit(pPager,bCommit), iVar10 == 0)) {
      pCache = pPager->pPCache;
      for (pPVar12 = pCache->pDirty; pPVar12 != (PgHdr *)0x0; pPVar12 = pPVar12->pDirtyNext) {
        *(byte *)&pPVar12->flags = (byte)pPVar12->flags & 0xf3;
      }
      pCache->pSynced = pCache->pDirtyTail;
    }
    else {
      pCache = pPager->pPCache;
      pPVar12 = pCache->pDirty;
      if (pPVar12 != (PgHdr *)0x0) {
        do {
          sqlite3PcacheMakeClean(pPVar12);
          pPVar12 = pCache->pDirty;
        } while (pPVar12 != (PgHdr *)0x0);
        pCache = pPager->pPCache;
      }
    }
    sqlite3PcacheTruncate(pCache,pPager->dbSize);
  }
  if (pPager->pWal == (Wal *)0x0) {
    if ((bCommit != 0) && (iVar9 == 0)) {
      iVar9 = 0;
      if (pPager->dbSize < pPager->dbFileSize) {
        iVar9 = pager_truncate(pPager,pPager->dbSize);
      }
    }
  }
  else {
    sqlite3WalEndWriteTransaction(pPager->pWal);
  }
  if ((bCommit != 0) && (iVar9 == 0)) {
    psVar4 = pPager->fd->pMethods;
    if ((psVar4 == (sqlite3_io_methods *)0x0) ||
       (iVar9 = (*psVar4->xFileControl)(pPager->fd,0x16,(void *)0x0), iVar9 == 0xc)) {
      iVar9 = 0;
    }
  }
  iVar11 = 0;
  iVar10 = 0;
  if (pPager->exclusiveMode == '\0') {
    pWVar8 = pPager->pWal;
    if (pWVar8 == (Wal *)0x0) {
LAB_0013a471:
      psVar4 = pPager->fd->pMethods;
      iVar10 = 0;
      if (psVar4 != (sqlite3_io_methods *)0x0) {
        if (pPager->noLock == '\0') {
          iVar10 = (*psVar4->xUnlock)(pPager->fd,1);
        }
        if (pPager->eLock != '\x05') {
          pPager->eLock = '\x01';
        }
      }
      pPager->changeCountDone = pPager->tempFile;
    }
    else {
      iVar10 = iVar11;
      if (pWVar8->exclusiveMode != '\0') {
        pWVar8->exclusiveMode = '\0';
        iVar11 = (*pWVar8->pDbFd->pMethods->xShmLock)(pWVar8->pDbFd,pWVar8->readLock + 3,1,6);
        if (iVar11 == 0) {
          if (pWVar8->exclusiveMode == '\0') goto LAB_0013a471;
        }
        else {
          pWVar8->exclusiveMode = '\x01';
        }
      }
    }
  }
  pPager->eState = '\x01';
  pPager->setSuper = '\0';
  if (iVar9 != 0) {
    iVar10 = iVar9;
  }
LAB_0013a4b0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar10;
  }
  __stack_chk_fail();
}

Assistant:

static int pager_end_transaction(Pager *pPager, int hasSuper, int bCommit){
  int rc = SQLITE_OK;      /* Error code from journal finalization operation */
  int rc2 = SQLITE_OK;     /* Error code from db file unlock operation */

  /* Do nothing if the pager does not have an open write transaction
  ** or at least a RESERVED lock. This function may be called when there
  ** is no write-transaction active but a RESERVED or greater lock is
  ** held under two circumstances:
  **
  **   1. After a successful hot-journal rollback, it is called with
  **      eState==PAGER_NONE and eLock==EXCLUSIVE_LOCK.
  **
  **   2. If a connection with locking_mode=exclusive holding an EXCLUSIVE
  **      lock switches back to locking_mode=normal and then executes a
  **      read-transaction, this function is called with eState==PAGER_READER
  **      and eLock==EXCLUSIVE_LOCK when the read-transaction is closed.
  */
  assert( assert_pager_state(pPager) );
  assert( pPager->eState!=PAGER_ERROR );
  if( pPager->eState<PAGER_WRITER_LOCKED && pPager->eLock<RESERVED_LOCK ){
    return SQLITE_OK;
  }

  releaseAllSavepoints(pPager);
  assert( isOpen(pPager->jfd) || pPager->pInJournal==0
      || (sqlite3OsDeviceCharacteristics(pPager->fd)&SQLITE_IOCAP_BATCH_ATOMIC)
  );
  if( isOpen(pPager->jfd) ){
    assert( !pagerUseWal(pPager) );

    /* Finalize the journal file. */
    if( sqlite3JournalIsInMemory(pPager->jfd) ){
      /* assert( pPager->journalMode==PAGER_JOURNALMODE_MEMORY ); */
      sqlite3OsClose(pPager->jfd);
    }else if( pPager->journalMode==PAGER_JOURNALMODE_TRUNCATE ){
      if( pPager->journalOff==0 ){
        rc = SQLITE_OK;
      }else{
        rc = sqlite3OsTruncate(pPager->jfd, 0);
        if( rc==SQLITE_OK && pPager->fullSync ){
          /* Make sure the new file size is written into the inode right away.
          ** Otherwise the journal might resurrect following a power loss and
          ** cause the last transaction to roll back.  See
          ** https://bugzilla.mozilla.org/show_bug.cgi?id=1072773
          */
          rc = sqlite3OsSync(pPager->jfd, pPager->syncFlags);
        }
      }
      pPager->journalOff = 0;
    }else if( pPager->journalMode==PAGER_JOURNALMODE_PERSIST
      || (pPager->exclusiveMode && pPager->journalMode<PAGER_JOURNALMODE_WAL)
    ){
      rc = zeroJournalHdr(pPager, hasSuper||pPager->tempFile);
      pPager->journalOff = 0;
    }else{
      /* This branch may be executed with Pager.journalMode==MEMORY if
      ** a hot-journal was just rolled back. In this case the journal
      ** file should be closed and deleted. If this connection writes to
      ** the database file, it will do so using an in-memory journal.
      */
      int bDelete = !pPager->tempFile;
      assert( sqlite3JournalIsInMemory(pPager->jfd)==0 );
      assert( pPager->journalMode==PAGER_JOURNALMODE_DELETE
           || pPager->journalMode==PAGER_JOURNALMODE_MEMORY
           || pPager->journalMode==PAGER_JOURNALMODE_WAL
      );
      sqlite3OsClose(pPager->jfd);
      if( bDelete ){
        rc = sqlite3OsDelete(pPager->pVfs, pPager->zJournal, pPager->extraSync);
      }
    }
  }

#ifdef SQLITE_CHECK_PAGES
  sqlite3PcacheIterateDirty(pPager->pPCache, pager_set_pagehash);
  if( pPager->dbSize==0 && sqlite3PcacheRefCount(pPager->pPCache)>0 ){
    PgHdr *p = sqlite3PagerLookup(pPager, 1);
    if( p ){
      p->pageHash = 0;
      sqlite3PagerUnrefNotNull(p);
    }
  }
#endif

  sqlite3BitvecDestroy(pPager->pInJournal);
  pPager->pInJournal = 0;
  pPager->nRec = 0;
  if( rc==SQLITE_OK ){
    if( MEMDB || pagerFlushOnCommit(pPager, bCommit) ){
      sqlite3PcacheCleanAll(pPager->pPCache);
    }else{
      sqlite3PcacheClearWritable(pPager->pPCache);
    }
    sqlite3PcacheTruncate(pPager->pPCache, pPager->dbSize);
  }

  if( pagerUseWal(pPager) ){
    /* Drop the WAL write-lock, if any. Also, if the connection was in
    ** locking_mode=exclusive mode but is no longer, drop the EXCLUSIVE
    ** lock held on the database file.
    */
    rc2 = sqlite3WalEndWriteTransaction(pPager->pWal);
    assert( rc2==SQLITE_OK );
  }else if( rc==SQLITE_OK && bCommit && pPager->dbFileSize>pPager->dbSize ){
    /* This branch is taken when committing a transaction in rollback-journal
    ** mode if the database file on disk is larger than the database image.
    ** At this point the journal has been finalized and the transaction
    ** successfully committed, but the EXCLUSIVE lock is still held on the
    ** file. So it is safe to truncate the database file to its minimum
    ** required size.  */
    assert( pPager->eLock==EXCLUSIVE_LOCK );
    rc = pager_truncate(pPager, pPager->dbSize);
  }

  if( rc==SQLITE_OK && bCommit ){
    rc = sqlite3OsFileControl(pPager->fd, SQLITE_FCNTL_COMMIT_PHASETWO, 0);
    if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
  }

  if( !pPager->exclusiveMode
   && (!pagerUseWal(pPager) || sqlite3WalExclusiveMode(pPager->pWal, 0))
  ){
    rc2 = pagerUnlockDb(pPager, SHARED_LOCK);
  }
  pPager->eState = PAGER_READER;
  pPager->setSuper = 0;

  return (rc==SQLITE_OK?rc2:rc);
}